

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O2

void xmlXPtrEvalChildSeq(xmlXPathParserContextPtr ctxt,xmlChar *name)

{
  byte bVar1;
  xmlNodeSetPtr pxVar2;
  bool bVar3;
  xmlXPathObjectPtr pxVar4;
  byte *pbVar5;
  int iVar6;
  xmlNodePtr pxVar7;
  _xmlNode **pp_Var8;
  int iVar9;
  int iVar10;
  
  if (name == (xmlChar *)0x0) {
    if ((*ctxt->cur == '/') && (ctxt->cur[1] != '1')) {
      xmlXPtrErr(ctxt,0x76d,"warning: ChildSeq not starting by /1\n",(xmlChar *)0x0);
    }
  }
  else {
    pxVar4 = xmlXPathNewString(name);
    valuePush(ctxt,pxVar4);
    (*xmlFree)(name);
    xmlXPathIdFunction(ctxt,1);
    if (ctxt->error != 0) {
      return;
    }
  }
  do {
    while( true ) {
      pbVar5 = ctxt->cur;
      if (*pbVar5 != 0x2f) {
        return;
      }
      bVar3 = false;
      iVar6 = 0;
      while( true ) {
        pbVar5 = pbVar5 + 1;
        ctxt->cur = pbVar5;
        bVar1 = *pbVar5;
        if (9 < (byte)(bVar1 - 0x30)) break;
        iVar9 = iVar6 * 10;
        if (0xccccccc < iVar6) {
          iVar9 = iVar6;
        }
        iVar10 = -0x7fffffd1 - (uint)bVar1;
        if (iVar10 < iVar9) {
          bVar3 = true;
        }
        if (0xccccccc < iVar6) {
          bVar3 = true;
        }
        iVar6 = bVar1 - 0x30;
        if (iVar10 < iVar9) {
          iVar6 = 0;
        }
        iVar6 = iVar6 + iVar9;
      }
      if (bVar3) {
        iVar6 = 0;
      }
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type == XPATH_NODESET)) break;
      xmlXPathErr(ctxt,0xb);
    }
    pxVar4 = valuePop(ctxt);
    pxVar2 = pxVar4->nodesetval;
    if ((pxVar2 == (xmlNodeSetPtr)0x0 || iVar6 < 1) || (pxVar2->nodeNr != 1)) {
LAB_001da364:
      xmlXPathFreeObject(pxVar4);
      pxVar4 = xmlXPathNewNodeSet((xmlNodePtr)0x0);
    }
    else {
      pxVar7 = *pxVar2->nodeTab;
      if (pxVar7 == (xmlNodePtr)0x0) goto LAB_001da364;
      if (pxVar7->type != XML_NAMESPACE_DECL) {
        pp_Var8 = &pxVar7->children;
        iVar9 = 0;
        while (pxVar7 = *pp_Var8, iVar9 <= iVar6) {
          if (pxVar7 == (xmlNodePtr)0x0) goto LAB_001da364;
          if (((pxVar7->type < XML_DTD_NODE) &&
              ((0x2202U >> (pxVar7->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) &&
             (iVar9 = iVar9 + 1, iVar9 == iVar6)) goto LAB_001da31d;
          pp_Var8 = &pxVar7->next;
        }
        if (pxVar7 == (xmlNodePtr)0x0) goto LAB_001da364;
      }
LAB_001da31d:
      *pxVar2->nodeTab = pxVar7;
    }
    valuePush(ctxt,pxVar4);
  } while( true );
}

Assistant:

static void
xmlXPtrEvalChildSeq(xmlXPathParserContextPtr ctxt, xmlChar *name) {
    /*
     * XPointer don't allow by syntax to address in multirooted trees
     * this might prove useful in some cases, warn about it.
     */
    if ((name == NULL) && (CUR == '/') && (NXT(1) != '1')) {
        xmlXPtrErr(ctxt, XML_XPTR_CHILDSEQ_START,
		   "warning: ChildSeq not starting by /1\n", NULL);
    }

    if (name != NULL) {
	valuePush(ctxt, xmlXPathNewString(name));
	xmlFree(name);
	xmlXPathIdFunction(ctxt, 1);
	CHECK_ERROR;
    }

    while (CUR == '/') {
	int child = 0, overflow = 0;
	NEXT;

	while ((CUR >= '0') && (CUR <= '9')) {
            int d = CUR - '0';
            if (child > INT_MAX / 10)
                overflow = 1;
            else
                child *= 10;
            if (child > INT_MAX - d)
                overflow = 1;
            else
                child += d;
	    NEXT;
	}
        if (overflow)
            child = 0;
	xmlXPtrGetChildNo(ctxt, child);
    }
}